

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::GenerateCommonBuilderMethods
          (MessageBuilderLiteGenerator *this,Printer *printer)

{
  string local_48;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  MessageBuilderLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  super(DEFAULT_INSTANCE);\n}\n\n"
            );
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_48,this->name_resolver_,this->descriptor_);
  protobuf::io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_28,(char (*) [10])0x1fb9081,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void MessageBuilderLiteGenerator::GenerateCommonBuilderMethods(
    io::Printer* printer) {
  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "  super(DEFAULT_INSTANCE);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
}